

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_converter.hpp
# Opt level: O2

type * __thiscall
jsoncons::
value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
::convert<char>(type *__return_storage_ptr__,
               value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *this,byte_string_view *value,semantic_tag tag,error_code *param_3)

{
  uchar *first;
  undefined3 in_register_00000009;
  uchar *last;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  first = value->data_;
  last = first + value->size_;
  if (CONCAT31(in_register_00000009,tag) == 8) {
    encode_base16<unsigned_char_const*,std::__cxx11::string>(first,last,__return_storage_ptr__);
  }
  else if (CONCAT31(in_register_00000009,tag) == 9) {
    encode_base64<unsigned_char_const*,std::__cxx11::string>(first,last,__return_storage_ptr__);
  }
  else {
    encode_base64url<unsigned_char_const*,std::__cxx11::string>(first,last,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

typename std::enable_if<ext_traits::is_narrow_character<CharT>::value,Into>::type
        convert(const From& value, semantic_tag tag, std::error_code&)
        {
            Into s(this->get_allocator());
            switch (tag)
            {
                case semantic_tag::base64:
                    encode_base64(value.begin(), value.end(), s);
                    break;
                case semantic_tag::base16:
                    encode_base16(value.begin(), value.end(), s);
                    break;
                default:
                    encode_base64url(value.begin(), value.end(), s);
                    break;
            }
            return s;
        }